

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

void dump_byte_array(nbt_byte_array ba,buffer *b)

{
  int local_24;
  int32_t i;
  buffer *b_local;
  nbt_byte_array ba_local;
  
  if (-1 < ba.length) {
    bprintf(b,"[ ");
    for (local_24 = 0; local_24 < ba.length; local_24 = local_24 + 1) {
      bprintf(b,"%u ",(ulong)ba.data[local_24]);
    }
    bprintf(b,"]");
    return;
  }
  __assert_fail("ba.length >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c",
                0x1e6,"void dump_byte_array(const struct nbt_byte_array, struct buffer *)");
}

Assistant:

static void dump_byte_array(const struct nbt_byte_array ba, struct buffer* b)
{
    assert(ba.length >= 0);

    bprintf(b, "[ ");
    for(int32_t i = 0; i < ba.length; ++i)
        bprintf(b, "%u ", +ba.data[i]);
    bprintf(b, "]");
}